

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.hxx
# Opt level: O0

void __thiscall nuraft::cluster_config::~cluster_config(cluster_config *this)

{
  long in_RDI;
  
  std::__cxx11::
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>::
  ~list((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
         *)0x18741c);
  std::__cxx11::string::~string((string *)(in_RDI + 0x18));
  return;
}

Assistant:

~cluster_config() {
    }